

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::IGXMLScanner::IGXMLScanner
          (IGXMLScanner *this,XMLValidator *valToAdopt,GrammarResolver *grammarResolver,
          MemoryManager *manager)

{
  int iVar1;
  undefined4 extraout_var;
  CleanupType_conflict13 cleanup;
  JanitorMemFunCall<xercesc_4_0::IGXMLScanner> local_28;
  
  XMLScanner::XMLScanner(&this->super_XMLScanner,valToAdopt,grammarResolver,manager);
  (this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler =
       (_func_int **)&PTR__IGXMLScanner_00415030;
  this->fSeeXsi = false;
  this->fGrammarType = UnKnown;
  this->fElemStateSize = 0x10;
  this->fElemState = (uint *)0x0;
  this->fElemLoopState = (uint *)0x0;
  (this->fContent).fIndex = 0;
  (this->fContent).fCapacity = 0x3ff;
  (this->fContent).fFullSize = 0;
  (this->fContent).fUsed = false;
  (this->fContent).fMemoryManager = manager;
  (this->fContent).fFullHandler = (XMLBufferFullHandler *)0x0;
  (this->fContent).fBuffer = (XMLCh *)0x0;
  iVar1 = (*manager->_vptr_MemoryManager[3])(manager,0x800);
  (this->fContent).fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar1);
  *(XMLCh *)CONCAT44(extraout_var,iVar1) = L'\0';
  this->fRawAttrList = (RefVectorOf<xercesc_4_0::KVStringPair> *)0x0;
  this->fRawAttrColonListSize = 0x20;
  this->fRawAttrColonList = (int *)0x0;
  this->fDTDValidator = (DTDValidator *)0x0;
  this->fSchemaValidator = (SchemaValidator *)0x0;
  this->fDTDGrammar = (DTDGrammar *)0x0;
  this->fICHandler = (IdentityConstraintHandler *)0x0;
  this->fLocationPairs = (ValueVectorOf<char16_t_*> *)0x0;
  this->fDTDElemNonDeclPool = (NameIdPool<xercesc_4_0::DTDElementDecl> *)0x0;
  this->fSchemaElemNonDeclPool =
       (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0;
  this->fElemCount = 0;
  this->fAttDefRegistry = (RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *)0x0;
  this->fUndeclaredAttrRegistry = (Hash2KeysSetOf<xercesc_4_0::StringHasher> *)0x0;
  this->fPSVIAttrList = (PSVIAttributeList *)0x0;
  this->fModel = (XSModel *)0x0;
  this->fPSVIElement = (PSVIElement *)0x0;
  this->fErrorStack = (ValueStackOf<bool> *)0x0;
  this->fSchemaInfoList =
       (RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *)0x0;
  this->fCachedSchemaInfoList =
       (RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *)0x0;
  local_28.fToCall = (MFPT)cleanUp;
  local_28._16_8_ = 0;
  local_28.fObject = this;
  commonInit(this);
  local_28.fObject = (IGXMLScanner *)0x0;
  JanitorMemFunCall<xercesc_4_0::IGXMLScanner>::~JanitorMemFunCall(&local_28);
  return;
}

Assistant:

IGXMLScanner::IGXMLScanner( XMLValidator* const  valToAdopt
                          , GrammarResolver* const grammarResolver
                          , MemoryManager* const manager) :

    XMLScanner(valToAdopt, grammarResolver, manager)
    , fSeeXsi(false)
    , fGrammarType(Grammar::UnKnown)
    , fElemStateSize(16)
    , fElemState(0)
    , fElemLoopState(0)
    , fContent(1023, manager)
    , fRawAttrList(0)
    , fRawAttrColonListSize(32)
    , fRawAttrColonList(0)
    , fDTDValidator(0)
    , fSchemaValidator(0)
    , fDTDGrammar(0)
    , fICHandler(0)
    , fLocationPairs(0)
    , fDTDElemNonDeclPool(0)
    , fSchemaElemNonDeclPool(0)
    , fElemCount(0)
    , fAttDefRegistry(0)
    , fUndeclaredAttrRegistry(0)
    , fPSVIAttrList(0)
    , fModel(0)
    , fPSVIElement(0)
    , fErrorStack(0)
    , fSchemaInfoList(0)
    , fCachedSchemaInfoList (0)
{
    CleanupType cleanup(this, &IGXMLScanner::cleanUp);

    try
    {
        commonInit();
    }
    catch(const OutOfMemoryException&)
    {
        // Don't cleanup when out of memory, since executing the
        // code can cause problems.
        cleanup.release();

        throw;
    }

    cleanup.release();
}